

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endianness.cc
# Opt level: O0

bool __thiscall
Typelib::CompileEndianSwapVisitor::visit_(CompileEndianSwapVisitor *this,Compound *type)

{
  size_t sVar1;
  bool bVar2;
  FieldList *this_00;
  pointer pFVar3;
  size_t sVar4;
  ulong uVar5;
  Type *pTVar6;
  size_t new_index;
  const_iterator it;
  const_iterator end;
  Fields *fields;
  size_t base_index;
  Compound *type_local;
  CompileEndianSwapVisitor *this_local;
  
  sVar1 = this->m_output_index;
  this_00 = Compound::getFields_abi_cxx11_(type);
  it = std::__cxx11::list<Typelib::Field,_std::allocator<Typelib::Field>_>::end(this_00);
  new_index = (size_t)std::__cxx11::list<Typelib::Field,_std::allocator<Typelib::Field>_>::begin
                                (this_00);
  while (bVar2 = std::operator!=((_Self *)&new_index,&it), bVar2) {
    pFVar3 = std::_List_const_iterator<Typelib::Field>::operator->
                       ((_List_const_iterator<Typelib::Field> *)&new_index);
    sVar4 = Field::getOffset(pFVar3);
    uVar5 = sVar1 + sVar4;
    if (this->m_output_index <= uVar5) {
      if (this->m_output_index < uVar5) {
        skip(this,(int)uVar5 - (int)this->m_output_index);
      }
      this->m_output_index = uVar5;
      pFVar3 = std::_List_const_iterator<Typelib::Field>::operator->
                         ((_List_const_iterator<Typelib::Field> *)&new_index);
      pTVar6 = Field::getType(pFVar3);
      TypeVisitor::dispatch(&this->super_TypeVisitor,pTVar6);
      pFVar3 = std::_List_const_iterator<Typelib::Field>::operator->
                         ((_List_const_iterator<Typelib::Field> *)&new_index);
      pTVar6 = Field::getType(pFVar3);
      sVar4 = Type::getSize(pTVar6);
      this->m_output_index = uVar5 + sVar4;
    }
    std::_List_const_iterator<Typelib::Field>::operator++
              ((_List_const_iterator<Typelib::Field> *)&new_index);
  }
  return true;
}

Assistant:

bool CompileEndianSwapVisitor::visit_ (Compound const& type)
    {
        size_t base_index = m_output_index;

        typedef Compound::FieldList Fields;
        Fields const& fields(type.getFields());
        Fields::const_iterator const end = fields.end();

        for (Fields::const_iterator it = fields.begin(); it != end; ++it)
        {
            size_t new_index = base_index + it->getOffset();
            if (new_index < m_output_index)
                continue;
            else if (new_index > m_output_index)
                skip(new_index - m_output_index);

            m_output_index = new_index;
            dispatch(it->getType());
            m_output_index = new_index + it->getType().getSize();
        }
        return true;
    }